

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O0

void math::internal::matrix_bidiagonalize<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *mat_b,double *mat_v,
               double *epsilon)

{
  int iVar1;
  int iVar2;
  int local_178;
  int local_174;
  int local_170;
  int j_3;
  int i_10;
  int i_9;
  int local_160;
  int local_15c;
  int i_8;
  int j_2;
  int i_7;
  int j_1;
  int i_6;
  int i_5;
  double *mat_v_tmp;
  double *update_v;
  double *mat_b_tmp;
  double *mat_b_res;
  double inner_house_beta;
  double *inner_house_mat;
  double *inner_house_vec;
  double *inner_input_vec;
  undefined1 local_100 [8];
  vector<double,_std::allocator<double>_> buffer2;
  int slice_cols;
  int slice_rows;
  int inner_sub_length;
  int i_4;
  double norm;
  int local_c8;
  int j;
  int i_3;
  int i_2;
  uint local_b4;
  double dStack_b0;
  int i_1;
  int local_a4;
  double *pdStack_a0;
  int i;
  double *mat_u_tmp;
  double *update_u;
  double house_beta;
  double *house_mat;
  double *house_vec;
  double *input_vec;
  allocator<double> local_59;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> buffer;
  uint local_38;
  int sub_length;
  int k;
  int steps;
  double *mat_v_local;
  double *mat_b_local;
  double *mat_u_local;
  int cols_local;
  int rows_local;
  double *mat_a_local;
  
  matrix_set_identity<double>(mat_u,rows);
  matrix_set_identity<double>(mat_v,cols);
  std::copy<double_const*,double*>(mat_a,mat_a + rows * cols,mat_b);
  local_178 = cols;
  if (rows == cols) {
    local_178 = cols + -1;
  }
  for (local_38 = 0; (int)local_38 < local_178; local_38 = local_38 + 1) {
    buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = rows - local_38;
    iVar1 = buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ * 2;
    iVar2 = buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ *
            buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<double>::allocator(&local_59);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_58,
               (long)(iVar1 + iVar2 + rows * rows * 2),&local_59);
    std::allocator<double>::~allocator(&local_59);
    house_vec = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_58,0);
    house_mat = house_vec +
                buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
    house_beta = (double)(house_mat +
                         buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_);
    mat_u_tmp = (double *)
                ((long)house_beta +
                (long)(buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_ *
                      buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_) * 8);
    pdStack_a0 = mat_u_tmp + rows * rows;
    for (local_a4 = 0;
        local_a4 <
        buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; local_a4 = local_a4 + 1) {
      house_vec[local_a4] = mat_b[(int)((local_38 + local_a4) * cols + local_38)];
    }
    dStack_b0 = 1.0;
    matrix_householder_vector<double>
              (house_vec,
               buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,house_mat,(double *)&update_u,epsilon
               ,&stack0xffffffffffffff50);
    matrix_householder_matrix<double>
              (house_mat,
               buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,(double)update_u,(double *)house_beta
              );
    matrix_apply_householder_matrix<double>
              (mat_b,rows,cols,(double *)house_beta,
               buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,local_38,local_38);
    local_b4 = local_38;
    while (local_b4 = local_b4 + 1, (int)local_b4 < rows) {
      mat_b[(int)(local_b4 * cols + local_38)] = 0.0;
    }
    _i_3 = 0.0;
    std::fill<double*,double>(mat_u_tmp,mat_u_tmp + (uint)(rows * rows),(double *)&i_3);
    for (j = 0; j < (int)local_38; j = j + 1) {
      mat_u_tmp[j * rows + j] = 1.0;
    }
    for (local_c8 = 0;
        local_c8 <
        buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_; local_c8 = local_c8 + 1) {
      for (norm._4_4_ = 0;
          norm._4_4_ <
          buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_; norm._4_4_ = norm._4_4_ + 1) {
        mat_u_tmp[(int)((local_38 + local_c8) * rows + local_38 + norm._4_4_)] =
             *(double *)
              ((long)house_beta +
              (long)(local_c8 *
                     buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_ + norm._4_4_) * 8);
      }
    }
    std::copy<double*,double*>(mat_u,mat_u + (uint)(rows * rows),pdStack_a0);
    matrix_multiply<double>(pdStack_a0,rows,rows,mat_u_tmp,rows,mat_u);
    if ((int)local_38 <= cols + -3) {
      _inner_sub_length = 0.0;
      slice_rows = local_38;
      while (slice_rows = slice_rows + 1, slice_rows < cols) {
        _inner_sub_length = mat_b[(int)(local_38 * cols + slice_rows)] + _inner_sub_length;
      }
      if ((0.0 - *epsilon <= _inner_sub_length) && (_inner_sub_length <= *epsilon + 0.0)) {
        _inner_sub_length = 1.0;
      }
      iVar1 = ~local_38 + cols;
      buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = rows - local_38;
      buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = ~local_38 + cols;
      iVar2 = buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ *
              (int)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      std::allocator<double>::allocator((allocator<double> *)((long)&inner_input_vec + 7));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_100,
                 (long)(iVar1 * 2 + iVar1 * iVar1 + iVar2 * 2 + cols * cols * 2),
                 (allocator<double> *)((long)&inner_input_vec + 7));
      std::allocator<double>::~allocator((allocator<double> *)((long)&inner_input_vec + 7));
      inner_house_vec =
           std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_100,0);
      inner_house_mat = inner_house_vec + iVar1;
      inner_house_beta = (double)(inner_house_mat + iVar1);
      mat_b_tmp = (double *)((long)inner_house_beta + (long)(iVar1 * iVar1) * 8);
      update_v = mat_b_tmp +
                 buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_ *
                 (int)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
      mat_v_tmp = update_v +
                  buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_ *
                  (int)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
      _i_6 = mat_v_tmp + cols * cols;
      for (j_1 = 0; j_1 < (int)((cols - local_38) + -1); j_1 = j_1 + 1) {
        inner_house_vec[j_1] = mat_b[(int)(local_38 * cols + local_38 + 1 + j_1)];
      }
      matrix_householder_vector<double>
                (inner_house_vec,iVar1,inner_house_mat,(double *)&mat_b_res,epsilon,
                 (double *)&inner_sub_length);
      matrix_householder_matrix<double>
                (inner_house_mat,iVar1,(double)mat_b_res,(double *)inner_house_beta);
      for (i_7 = 0; i_7 < buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_; i_7 = i_7 + 1) {
        for (j_2 = 0; j_2 < (int)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage; j_2 = j_2 + 1) {
          update_v[i_7 * (int)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + j_2] =
               mat_b[(int)((local_38 + i_7) * cols + local_38 + 1 + j_2)];
        }
      }
      matrix_multiply<double>
                (update_v,buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_,
                 (int)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(double *)inner_house_beta,iVar1,
                 mat_b_tmp);
      for (i_8 = 0; i_8 < buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage._4_4_; i_8 = i_8 + 1) {
        for (local_15c = 0;
            local_15c <
            (int)buffer2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage; local_15c = local_15c + 1) {
          mat_b[(int)((local_38 + i_8) * cols + local_38 + 1 + local_15c)] =
               mat_b_tmp[i_8 * (int)buffer2.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + local_15c];
        }
      }
      for (local_160 = local_38 + 2; local_160 < cols; local_160 = local_160 + 1) {
        mat_b[(int)(local_38 * cols + local_160)] = 0.0;
      }
      _i_10 = 0.0;
      std::fill<double*,double>(mat_v_tmp,mat_v_tmp + (uint)(cols * cols),(double *)&i_10);
      for (j_3 = 0; j_3 < (int)(local_38 + 1); j_3 = j_3 + 1) {
        mat_v_tmp[j_3 * cols + j_3] = 1.0;
      }
      for (local_170 = 0; local_170 < iVar1; local_170 = local_170 + 1) {
        for (local_174 = 0; local_174 < iVar1; local_174 = local_174 + 1) {
          mat_v_tmp[(int)((local_38 + local_170 + 1) * cols + local_38 + local_174 + 1)] =
               *(double *)((long)inner_house_beta + (long)(local_170 * iVar1 + local_174) * 8);
        }
      }
      std::copy<double*,double*>(mat_v,mat_v + (uint)(cols * cols),_i_6);
      matrix_multiply<double>(_i_6,cols,cols,mat_v_tmp,cols,mat_v);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_100);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_58);
  }
  return;
}

Assistant:

void
matrix_bidiagonalize (T const* mat_a, int rows, int cols, T* mat_u,
    T* mat_b, T* mat_v, T const& epsilon)
{
    /* Initialize U and V with identity matrices. */
    matrix_set_identity(mat_u, rows);
    matrix_set_identity(mat_v, cols);

    /* Copy mat_a into mat_b. */
    std::copy(mat_a, mat_a + rows * cols, mat_b);

    int const steps = (rows == cols) ? (cols - 1) : cols;
    for (int k = 0; k < steps; ++k)
    {
        int const sub_length = rows - k;
        std::vector<T> buffer(sub_length // input_vec
            + sub_length // house_vec
            + sub_length * sub_length // house_mat
            + rows * rows // update_u
            + rows * rows); // mat_u_tmp
        T* input_vec = &buffer[0];
        T* house_vec = input_vec + sub_length;
        T* house_mat = house_vec + sub_length;
        T house_beta;
        T* update_u = house_mat + sub_length * sub_length;
        T* mat_u_tmp = update_u + rows * rows;

        for (int i = 0; i < sub_length; ++i)
            input_vec[i] = mat_b[(k + i) * cols + k];

        matrix_householder_vector(input_vec, sub_length, house_vec,
            &house_beta, epsilon, T(1));
        matrix_householder_matrix(house_vec, sub_length,
            house_beta, house_mat);
        matrix_apply_householder_matrix(mat_b, rows, cols,
            house_mat, sub_length, k, k);

        for (int i = k + 1; i < rows; ++i)
            mat_b[i * cols + k] = T(0);

        /* Construct U update matrix and update U. */
        std::fill(update_u, update_u + rows * rows, T(0));
        for (int i = 0; i < k; ++i)
            update_u[i * rows + i] = T(1);
        for (int i = 0; i < sub_length; ++i)
        {
            for (int j = 0; j < sub_length; ++j)
            {
                update_u[(k + i) * rows + (k + j)] =
                    house_mat[i * sub_length + j];
            }
        }

        /* Copy matrix U for multiplication. */
        std::copy(mat_u, mat_u + rows * rows, mat_u_tmp);
        matrix_multiply(mat_u_tmp, rows, rows, update_u, rows, mat_u);

        if (k <= cols - 3)
        {
            /* Normalization constant for numerical stability. */
            T norm(0);
            for (int i = k + 1; i < cols; ++i)
                norm += mat_b[k * cols + i];
            if (MATH_EPSILON_EQ(norm, T(0), epsilon))
                norm = T(1);

            int const inner_sub_length = cols - (k + 1);
            int const slice_rows = rows - k;
            int const slice_cols = cols - k - 1;
            std::vector<T> buffer2(inner_sub_length // inner_input_vec
                + inner_sub_length // inner_house_vec
                + inner_sub_length * inner_sub_length // inner_house_mat
                + slice_rows * slice_cols // mat_b_res
                + slice_rows * slice_cols // mat_b_tmp
                + cols * cols // update_v
                + cols * cols); // mat_v_tmp

            T* inner_input_vec = &buffer2[0];
            T* inner_house_vec = inner_input_vec + inner_sub_length;
            T* inner_house_mat = inner_house_vec + inner_sub_length;
            T inner_house_beta;
            T* mat_b_res = inner_house_mat  + inner_sub_length * inner_sub_length;
            T* mat_b_tmp = mat_b_res + slice_rows * slice_cols;
            T* update_v = mat_b_tmp + slice_rows * slice_cols;
            T* mat_v_tmp = update_v + cols * cols;

            for (int i = 0; i < cols - k - 1; ++i)
                inner_input_vec[i] = mat_b[k * cols + (k + 1 + i)];

            matrix_householder_vector(inner_input_vec, inner_sub_length,
                inner_house_vec, &inner_house_beta, epsilon, norm);
            matrix_householder_matrix(inner_house_vec, inner_sub_length,
                inner_house_beta, inner_house_mat);

            /* Cut out mat_b(k:m, (k+1):n). */
            for (int i = 0; i < slice_rows; ++i)
            {
                for (int j = 0; j < slice_cols; ++j)
                {
                    mat_b_tmp[i * slice_cols + j] =
                        mat_b[(k + i) * cols + (k + 1 + j)];
                }
            }
            matrix_multiply(mat_b_tmp, slice_rows, slice_cols,
                inner_house_mat, inner_sub_length, mat_b_res);

            /* Write frame back into mat_b. */
            for (int i = 0; i < slice_rows; ++i)
            {
                for (int j = 0; j < slice_cols; ++j)
                {
                    mat_b[(k + i) * cols + (k + 1 + j)] =
                        mat_b_res[i * slice_cols + j];
                }
            }

            for (int i = k + 2; i < cols; ++i)
                mat_b[k * cols + i] = T(0);

            std::fill(update_v, update_v + cols * cols, T(0));
            for (int i = 0; i < k + 1; ++i)
                update_v[i * cols + i] = T(1);
            for (int i = 0; i < inner_sub_length; ++i)
            {
                for (int j = 0; j < inner_sub_length; ++j)
                {
                    update_v[(k + i + 1) * cols + (k + j + 1)] =
                        inner_house_mat[i * inner_sub_length + j];
                }
            }

            /* Copy matrix v for multiplication. */
            std::copy(mat_v, mat_v + cols * cols, mat_v_tmp);
            matrix_multiply(mat_v_tmp, cols, cols, update_v, cols, mat_v);
        }
    }
}